

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superGate.c
# Opt level: O0

void Super_WriteLibraryGate(FILE *pFile,Super_Man_t *pMan,Super_Gate_t_conflict *pGate,int Num)

{
  char *pcVar1;
  double local_38;
  int local_28;
  int i;
  int Num_local;
  Super_Gate_t_conflict *pGate_local;
  Super_Man_t *pMan_local;
  FILE *pFile_local;
  
  fprintf((FILE *)pFile,"%04d  ",(ulong)(uint)Num);
  Extra_PrintBinary(pFile,pGate->uTruth,pMan->nMints);
  fprintf((FILE *)pFile,"   %5.2f",(double)pGate->tDelayMax);
  fprintf((FILE *)pFile,"  ");
  for (local_28 = 0; local_28 < pMan->nVarsMax; local_28 = local_28 + 1) {
    if ((pGate->ptDelays[local_28] != -9999.0) || (NAN(pGate->ptDelays[local_28]))) {
      local_38 = (double)pGate->ptDelays[local_28];
    }
    else {
      local_38 = 0.0;
    }
    fprintf((FILE *)pFile," %5.2f",local_38);
  }
  fprintf((FILE *)pFile,"   %5.2f",(double)pGate->Area);
  fprintf((FILE *)pFile,"   ");
  pcVar1 = Super_WriteLibraryGateName(pGate);
  fprintf((FILE *)pFile,"%s",pcVar1);
  fprintf((FILE *)pFile,"\n");
  return;
}

Assistant:

void Super_WriteLibraryGate( FILE * pFile, Super_Man_t * pMan, Super_Gate_t * pGate, int Num )
{
    int i;
    fprintf( pFile, "%04d  ", Num );                         // the number
    Extra_PrintBinary( pFile, pGate->uTruth, pMan->nMints ); // the truth table
    fprintf( pFile, "   %5.2f", pGate->tDelayMax );          // the max delay
    fprintf( pFile, "  " );                                  
    for ( i = 0; i < pMan->nVarsMax; i++ )                   // the pin-to-pin delays
        fprintf( pFile, " %5.2f", pGate->ptDelays[i]==SUPER_NO_VAR? 0.0 : pGate->ptDelays[i] );  
    fprintf( pFile, "   %5.2f", pGate->Area );               // the area
    fprintf( pFile, "   " );
    fprintf( pFile, "%s", Super_WriteLibraryGateName(pGate) );      // the symbolic expression
    fprintf( pFile, "\n" );
}